

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

Fl_Help_Link * __thiscall Fl_Help_View::find_link(Fl_Help_View *this,int xx,int yy)

{
  Fl_Help_Link *pFVar1;
  int iVar2;
  
  pFVar1 = this->links_;
  iVar2 = this->nlinks_;
  while( true ) {
    if (iVar2 < 1) {
      if (-1 < this->nlinks_) {
        pFVar1 = (Fl_Help_Link *)0x0;
      }
      return pFVar1;
    }
    if ((((pFVar1->x <= xx) && (xx < pFVar1->w)) && (pFVar1->y <= yy)) && (yy < pFVar1->h)) break;
    iVar2 = iVar2 + -1;
    pFVar1 = pFVar1 + 1;
  }
  return pFVar1;
}

Assistant:

Fl_Help_Link *Fl_Help_View::find_link(int xx, int yy)
{
  int		i;
  Fl_Help_Link	*linkp;
  for (i = nlinks_, linkp = links_; i > 0; i --, linkp ++) {
    if (xx >= linkp->x && xx < linkp->w &&
        yy >= linkp->y && yy < linkp->h)
      break;
  }
  return i ? linkp : 0L;
}